

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O0

Server * __thiscall ws::Server::run(Server *this)

{
  TaskQueue *__p;
  pointer pTVar1;
  FormatWithLoc local_128;
  anon_class_16_2_d1d5a652 local_100;
  Handler local_f0;
  allocator<char> local_c9;
  string local_c8;
  anon_class_8_1_8991fb9c local_a8;
  Handler local_a0;
  allocator<char> local_79;
  string local_78;
  undefined **local_48;
  FormatWithLoc local_40;
  unique_ptr<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>_> local_18;
  unique_ptr<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>_> task_queue;
  Server *this_local;
  
  task_queue._M_t.
  super___uniq_ptr_impl<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>_>._M_t.
  super__Tuple_impl<0UL,_httplib::TaskQueue_*,_std::default_delete<httplib::TaskQueue>_>.
  super__Head_base<0UL,_httplib::TaskQueue_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>,_true,_true>)
       (__uniq_ptr_data<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>,_true,_true>)
       this;
  __p = std::function<httplib::TaskQueue_*()>::operator()(&this->new_task_queue);
  std::unique_ptr<httplib::TaskQueue,std::default_delete<httplib::TaskQueue>>::
  unique_ptr<std::default_delete<httplib::TaskQueue>,void>
            ((unique_ptr<httplib::TaskQueue,std::default_delete<httplib::TaskQueue>> *)&local_18,__p
            );
  if ((this->inited & 1U) == 0) {
    local_48 = &PTR_s__workspace_llm4binary_github_lic_00277530;
    FormatWithLoc::FormatWithLoc(&local_40,(string *)no_fmt_abi_cxx11_,(source_location)0x277530);
    critical<char_const(&)[12]>(&local_40,(char (*) [12])"Not inited.");
    FormatWithLoc::~FormatWithLoc(&local_40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/",&local_79);
  local_a8.this = this;
  std::function<void(httplib::Request_const&,httplib::Response&)>::
  function<ws::Server::run()::_lambda(httplib::Request_const&,httplib::Response&)_1_,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_a0,&local_a8);
  httplib::Server::Get(&this->svr,&local_78,&local_a0);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"/",&local_c9);
  local_100.task_queue = &local_18;
  local_100.this = this;
  std::function<void(httplib::Request_const&,httplib::Response&)>::
  function<ws::Server::run()::_lambda(httplib::Request_const&,httplib::Response&)_2_,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_f0,&local_100);
  httplib::Server::Post(&this->svr,&local_c8,&local_f0);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  FormatWithLoc::FormatWithLoc(&local_128,(string *)no_fmt_abi_cxx11_,(source_location)0x277548);
  info<char_const(&)[23],std::__cxx11::string&,char_const(&)[9],int&>
            (&local_128,(char (*) [23])"Server started. Host: ",&this->host,(char (*) [9])", Port: "
             ,&this->port);
  FormatWithLoc::~FormatWithLoc(&local_128);
  httplib::Server::listen(&this->svr,(int)this + 8,this->port);
  pTVar1 = std::unique_ptr<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>_>::operator->
                     (&local_18);
  (*pTVar1->_vptr_TaskQueue[3])();
  std::unique_ptr<httplib::TaskQueue,_std::default_delete<httplib::TaskQueue>_>::~unique_ptr
            (&local_18);
  return this;
}

Assistant:

Server &run()
    {
      std::unique_ptr<httplib::TaskQueue> task_queue(new_task_queue());
      if (!inited)
      {
        critical(no_fmt, "Not inited.");
      }
      svr.Get("/",
              [this](const httplib::Request &req, httplib::Response &res)
              {
                auto msg_sig = req.get_param_value("msg_signature");
                auto timestamp = req.get_param_value("timestamp");
                auto nonce = req.get_param_value("nonce");
                auto req_echostr = req.get_param_value("echostr");
                auto echostr = crypto.verify_url(msg_sig, timestamp, nonce, req_echostr);
                res.set_content(echostr, "text/plain");
                info(no_fmt, "Verify url successfully.");
              });
      svr.Post("/",
               [this, &task_queue](const httplib::Request &req, httplib::Response &res)
               {
                 auto a = req.body.find("<xml>");
                 auto b = req.body.find("</xml>");
                 auto req_xml = req.body.substr(a, b + 6);
  
                 auto msg_encrypt = details::xml_parse(req_xml, "Encrypt");
                 std::string plain_xml;
                 try
                 {
                   plain_xml = crypto.decrypt_msg(req.get_param_value("msg_signature"),
                                                  req.get_param_value("timestamp"),
                                                  req.get_param_value("nonce"),
                                                  details::xml_parse(req_xml, "Encrypt"));
                 }
                 catch (MsgCryptoError &err)
                 {
                   error(FormatWithLoc(no_fmt, err.location), err.what());
                   return;
                 }
  
                 Request wxreq;
  
                 wxreq.content = details::xml_parse(plain_xml, "Content");
                 wxreq.user_id = details::xml_parse(plain_xml, "FromUserName");
                 if (auto type = details::xml_parse(plain_xml, "MsgType"); type == "text")
                 {
                   wxreq.msg_type = Request::MsgType::text;
                 }
                 else
                 {
                   wxreq.msg_type = Request::MsgType::unknown;
                 }
  
                 info(no_fmt, "From: ", wxreq.user_id, " | Content: ", wxreq.content);
  
                 if (msg_handle)
                 {
                   task_queue->enqueue([this, wxreq]()
                                       {
                                         Message wxres;
                                         msg_handle(wxreq, wxres);
                                         if (wxres.to_user.empty())
                                         {
                                           wxres.set_user(wxreq.user_id);
                                         }
                                         send_message(wxres);
                                       });
                 }
               });
      info(no_fmt, "Server started. Host: ", host, ", Port: ", port);
      svr.listen(host, port);
      task_queue->shutdown();
      return *this;
    }